

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

ptls_key_schedule_t *
key_schedule_new(ptls_cipher_suite_t *preferred,ptls_cipher_suite_t **offered,int use_outer)

{
  ptls_cipher_suite_t *ppVar1;
  ptls_cipher_suite_t **pppVar2;
  void *__dest;
  long lVar3;
  ptls_hash_context_t *ppVar4;
  size_t local_d0;
  size_t j_1;
  size_t i_1;
  ptls_cipher_suite_t *cs_1;
  size_t local_50;
  size_t j;
  size_t i;
  ptls_cipher_suite_t *cs;
  size_t num_hashes;
  ptls_key_schedule_t *sched;
  ptls_cipher_suite_t **pppStack_20;
  int use_outer_local;
  ptls_cipher_suite_t **offered_local;
  ptls_cipher_suite_t *preferred_local;
  
  cs = (ptls_cipher_suite_t *)(ulong)(preferred != (ptls_cipher_suite_t *)0x0);
  i = (size_t)preferred;
  if (offered != (ptls_cipher_suite_t **)0x0) {
    for (j = 0; ppVar1 = offered[j], ppVar1 != (ptls_cipher_suite_t *)0x0; j = j + 1) {
      if ((preferred == (ptls_cipher_suite_t *)0x0) || (ppVar1->hash != preferred->hash)) {
        local_50 = 0;
        while ((local_50 != j && (ppVar1->hash != offered[local_50]->hash))) {
          local_50 = local_50 + 1;
        }
        if (local_50 == j) {
          cs = (ptls_cipher_suite_t *)((long)&cs->id + 1);
        }
      }
    }
    i = 0;
  }
  sched._4_4_ = use_outer;
  pppStack_20 = offered;
  offered_local = (ptls_cipher_suite_t **)preferred;
  __dest = malloc((long)cs * 0x18 + 0x50);
  if (__dest == (void *)0x0) {
    return (ptls_key_schedule_t *)0x0;
  }
  num_hashes = (size_t)__dest;
  memset(&cs_1,0,0x68);
  memcpy(__dest,&cs_1,0x68);
  pppVar2 = offered_local;
  if (offered_local != (ptls_cipher_suite_t **)0x0) {
    *(ptls_cipher_suite_t **)(num_hashes + 0x50 + *(long *)(num_hashes + 0x48) * 0x18) =
         offered_local[2];
    lVar3 = (*(code *)offered_local[2]->name)();
    *(long *)(num_hashes + *(long *)(num_hashes + 0x48) * 0x18 + 0x58) = lVar3;
    if (lVar3 == 0) {
LAB_00119a0e:
      key_schedule_free((ptls_key_schedule_t *)num_hashes);
      return (ptls_key_schedule_t *)0x0;
    }
    if (sched._4_4_ == 0) {
      *(undefined8 *)(num_hashes + *(long *)(num_hashes + 0x48) * 0x18 + 0x60) = 0;
    }
    else {
      lVar3 = (*(code *)pppVar2[2]->name)();
      *(long *)(num_hashes + *(long *)(num_hashes + 0x48) * 0x18 + 0x60) = lVar3;
      if (lVar3 == 0) goto LAB_00119a0e;
    }
    *(long *)(num_hashes + 0x48) = *(long *)(num_hashes + 0x48) + 1;
  }
  if (pppStack_20 != (ptls_cipher_suite_t **)0x0) {
    for (j_1 = 0; ppVar1 = pppStack_20[j_1], ppVar1 != (ptls_cipher_suite_t *)0x0; j_1 = j_1 + 1) {
      if ((offered_local == (ptls_cipher_suite_t **)0x0) ||
         (ppVar1->hash != (ptls_hash_algorithm_t *)offered_local[2])) {
        local_d0 = 0;
        while ((local_d0 != j_1 && (ppVar1->hash != pppStack_20[local_d0]->hash))) {
          local_d0 = local_d0 + 1;
        }
        if (local_d0 == j_1) {
          *(ptls_hash_algorithm_t **)(num_hashes + 0x50 + *(long *)(num_hashes + 0x48) * 0x18) =
               ppVar1->hash;
          ppVar4 = (*ppVar1->hash->create)();
          *(ptls_hash_context_t **)(num_hashes + *(long *)(num_hashes + 0x48) * 0x18 + 0x58) =
               ppVar4;
          if (ppVar4 == (ptls_hash_context_t *)0x0) goto LAB_00119a0e;
          if (sched._4_4_ == 0) {
            *(undefined8 *)(num_hashes + *(long *)(num_hashes + 0x48) * 0x18 + 0x60) = 0;
          }
          else {
            ppVar4 = (*ppVar1->hash->create)();
            *(ptls_hash_context_t **)(num_hashes + *(long *)(num_hashes + 0x48) * 0x18 + 0x60) =
                 ppVar4;
            if (ppVar4 == (ptls_hash_context_t *)0x0) goto LAB_00119a0e;
          }
          *(long *)(num_hashes + 0x48) = *(long *)(num_hashes + 0x48) + 1;
        }
      }
    }
  }
  return (ptls_key_schedule_t *)num_hashes;
}

Assistant:

static ptls_key_schedule_t *key_schedule_new(ptls_cipher_suite_t *preferred, ptls_cipher_suite_t **offered, int use_outer)
{
#define FOREACH_HASH(block)                                                                                                        \
    do {                                                                                                                           \
        ptls_cipher_suite_t *cs;                                                                                                   \
        if ((cs = preferred) != NULL) {                                                                                            \
            block                                                                                                                  \
        }                                                                                                                          \
        if (offered != NULL) {                                                                                                     \
            size_t i, j;                                                                                                           \
            for (i = 0; (cs = offered[i]) != NULL; ++i) {                                                                          \
                if (preferred == NULL || cs->hash != preferred->hash) {                                                            \
                    for (j = 0; j != i; ++j)                                                                                       \
                        if (cs->hash == offered[j]->hash)                                                                          \
                            break;                                                                                                 \
                    if (j == i) {                                                                                                  \
                        block                                                                                                      \
                    }                                                                                                              \
                }                                                                                                                  \
            }                                                                                                                      \
        }                                                                                                                          \
    } while (0)

    ptls_key_schedule_t *sched;

    { /* allocate */
        size_t num_hashes = 0;
        FOREACH_HASH({ ++num_hashes; });
        if ((sched = malloc(offsetof(ptls_key_schedule_t, hashes) + sizeof(sched->hashes[0]) * num_hashes)) == NULL)
            return NULL;
        *sched = (ptls_key_schedule_t){0};
    }

    /* setup the hash algos and contexts */
    FOREACH_HASH({
        sched->hashes[sched->num_hashes].algo = cs->hash;
        if ((sched->hashes[sched->num_hashes].ctx = cs->hash->create()) == NULL)
            goto Fail;
        if (use_outer) {
            if ((sched->hashes[sched->num_hashes].ctx_outer = cs->hash->create()) == NULL)
                goto Fail;
        } else {
            sched->hashes[sched->num_hashes].ctx_outer = NULL;
        }
        ++sched->num_hashes;
    });

    return sched;
Fail:
    key_schedule_free(sched);
    return NULL;

#undef FOREACH_HASH
}